

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3WalkExprList(Walker *pWalker,ExprList *p)

{
  int iVar1;
  int iVar2;
  ExprList_item *pEVar3;
  
  if ((p != (ExprList *)0x0) && (0 < p->nExpr)) {
    pEVar3 = p->a;
    iVar2 = p->nExpr + 1;
    do {
      if ((pEVar3->pExpr != (Expr *)0x0) &&
         (iVar1 = sqlite3WalkExprNN(pWalker,pEVar3->pExpr), iVar1 != 0)) {
        return 2;
      }
      pEVar3 = pEVar3 + 1;
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalkExprList(Walker *pWalker, ExprList *p){
  int i;
  struct ExprList_item *pItem;
  if( p ){
    for(i=p->nExpr, pItem=p->a; i>0; i--, pItem++){
      if( sqlite3WalkExpr(pWalker, pItem->pExpr) ) return WRC_Abort;
    }
  }
  return WRC_Continue;
}